

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_1::WatWriter::WriteEvent(WatWriter *this,Event *event)

{
  string_view str;
  NextChar in_R8D;
  
  WriteOpenSpace(this,"event");
  str.data_ = (event->name)._M_dataplus._M_p;
  str.size_ = (event->name)._M_string_length;
  WriteNameOrIndex(this,str,this->event_index_,in_R8D);
  WriteInlineExports(this,Event,this->event_index_);
  WriteInlineImport(this,Event,this->event_index_);
  if ((event->decl).has_func_type == true) {
    WriteOpenSpace(this,"type");
    WriteVar(this,&(event->decl).type_var,None);
    WriteCloseSpace(this);
  }
  WriteTypes(this,&(event->decl).sig.param_types,"param");
  this->event_index_ = this->event_index_ + 1;
  WriteCloseNewline(this);
  return;
}

Assistant:

void WatWriter::WriteEvent(const Event& event) {
  WriteOpenSpace("event");
  WriteNameOrIndex(event.name, event_index_, NextChar::Space);
  WriteInlineExports(ExternalKind::Event, event_index_);
  WriteInlineImport(ExternalKind::Event, event_index_);
  if (event.decl.has_func_type) {
    WriteOpenSpace("type");
    WriteVar(event.decl.type_var, NextChar::None);
    WriteCloseSpace();
  }
  WriteTypes(event.decl.sig.param_types, "param");
  ++event_index_;
  WriteCloseNewline();
}